

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O1

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [121];
  uint local_c4;
  bool local_bd;
  undefined4 local_bc;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 uStack_50;
  undefined7 local_4f;
  undefined1 uStack_48;
  undefined1 *puStack_47;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    if (precision - 0x79U < 0xffffff88) {
      bVar1 = false;
    }
    else {
      local_bc = 0xaaaaaaaa;
      local_bd = true;
      uStack_48 = 0xaa;
      puStack_47 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = 0xaa;
      local_4f = 0xaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c4 = 0xaaaaaaaa;
      DoubleToAscii(value,PRECISION,precision,(char *)&local_b8,0x79,&local_bd,(int *)&local_c4,
                    &local_bc);
      if ((local_bd == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
        iVar4 = *(int *)(result_builder + 0x10);
        *(int *)(result_builder + 0x10) = iVar4 + 1;
        *(undefined1 *)(*(long *)result_builder + (long)iVar4) = 0x2d;
      }
      bVar1 = true;
      if ((int)(1 - local_bc) <= this->max_leading_padding_zeroes_in_precision_mode_) {
        bVar1 = this->max_trailing_padding_zeroes_in_precision_mode_ <
                (int)((local_bc - precision) + (uint)(((uint)this->flags_ >> 2 & 1) != 0));
      }
      if ((this->flags_ & 0x10) != 0) {
        uVar3 = 1;
        if (1 < (int)local_bc) {
          uVar3 = local_bc;
        }
        if (bVar1) {
          uVar3 = 1;
        }
        uVar2 = (ulong)local_c4;
        if ((int)uVar3 < (int)local_c4) {
          uVar2 = (ulong)(int)local_c4;
          do {
            if (*(char *)((long)&local_bc + uVar2 + 3) != '0') goto LAB_003e9f8e;
            local_c4 = (int)uVar2 - 1;
            uVar2 = uVar2 - 1;
          } while ((long)(ulong)uVar3 < (long)uVar2);
          uVar2 = (ulong)uVar3;
        }
LAB_003e9f8e:
        if ((int)uVar2 < precision) {
          precision = (int)uVar2;
        }
      }
      if (bVar1) {
        iVar4 = local_bc - 1;
        if ((int)local_c4 < precision) {
          memset((void *)((long)&local_b8 + (long)(int)local_c4),0x30,
                 (ulong)(~local_c4 + precision) + 1);
        }
        CreateExponentialRepresentation(this,(char *)&local_b8,precision,iVar4,result_builder);
      }
      else {
        iVar4 = 0;
        if (0 < (int)(precision - local_bc)) {
          iVar4 = precision - local_bc;
        }
        CreateDecimalRepresentation(this,(char *)&local_b8,local_c4,local_bc,iVar4,result_builder);
      }
      bVar1 = true;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return bVar1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  bool as_exponential =
      (-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_);
  if ((flags_ & NO_TRAILING_ZERO) != 0) {
    // Truncate trailing zeros that occur after the decimal point (if exponential,
    // that is everything after the first digit).
    int stop = as_exponential ? 1 : std::max(1, decimal_point);
    while (decimal_rep_length > stop && decimal_rep[decimal_rep_length - 1] == '0') {
      --decimal_rep_length;
    }
    // Clamp precision to avoid the code below re-adding the zeros.
    precision = std::min(precision, decimal_rep_length);
  }
  if (as_exponential) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}